

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::RepeatedPrimitiveFieldGenerator::GenerateInlineAccessorDefinitions
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "inline $type$ $classname$::$name$(int index) const {\n  return $name$_.Get(index);\n}\ninline void $classname$::set_$name$(int index, $type$ value) {\n  $name$_.Set(index, value);\n}\ninline void $classname$::add_$name$($type$ value) {\n  $name$_.Add(value);\n}\n"
                    );
  io::Printer::Print(printer,&this->variables_,
                     "inline const ::google::protobuf::RepeatedField< $type$ >&\n$classname$::$name$() const {\n  return $name$_;\n}\ninline ::google::protobuf::RepeatedField< $type$ >*\n$classname$::mutable_$name$() {\n  return &$name$_;\n}\n"
                    );
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateInlineAccessorDefinitions(io::Printer* printer) const {
  printer->Print(variables_,
    "inline $type$ $classname$::$name$(int index) const {\n"
    "  return $name$_.Get(index);\n"
    "}\n"
    "inline void $classname$::set_$name$(int index, $type$ value) {\n"
    "  $name$_.Set(index, value);\n"
    "}\n"
    "inline void $classname$::add_$name$($type$ value) {\n"
    "  $name$_.Add(value);\n"
    "}\n");
  printer->Print(variables_,
    "inline const ::google::protobuf::RepeatedField< $type$ >&\n"
    "$classname$::$name$() const {\n"
    "  return $name$_;\n"
    "}\n"
    "inline ::google::protobuf::RepeatedField< $type$ >*\n"
    "$classname$::mutable_$name$() {\n"
    "  return &$name$_;\n"
    "}\n");
}